

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O2

int yajl_config(yajl_handle h,yajl_option opt,...)

{
  int iVar1;
  int local_a8;
  va_list ap;
  
  iVar1 = 0;
  if ((opt < (yajl_allow_partial_values|yajl_allow_comments)) &&
     (iVar1 = 0,
     (0x10116U >>
      (opt & (yajl_allow_partial_values|yajl_allow_multiple_values|yajl_allow_trailing_garbage|
              yajl_dont_validate_strings|yajl_allow_comments)) & 1) != 0)) {
    if (local_a8 == 0) {
      h->flags = h->flags & ~opt;
    }
    else {
      h->flags = h->flags | opt;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
yajl_config(yajl_handle h, yajl_option opt, ...)
{
    int rv = 1;
    va_list ap;
    va_start(ap, opt);

    switch(opt) {
        case yajl_allow_comments:
        case yajl_dont_validate_strings:
        case yajl_allow_trailing_garbage:
        case yajl_allow_multiple_values:
        case yajl_allow_partial_values:
            if (va_arg(ap, int)) h->flags |= opt;
            else h->flags &= ~opt;
            break;
        default:
            rv = 0;
    }
    va_end(ap);

    return rv;
}